

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateUp
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  uint uVar1;
  Var x;
  Var x_00;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  Var *pVVar5;
  int iVar6;
  
  pVVar5 = (this->heap).data;
  x = pVVar5[i];
  if (i == 0) {
    iVar6 = 0;
  }
  else {
    do {
      uVar1 = i - 1;
      iVar6 = (int)uVar1 >> 1;
      x_00 = pVVar5[iVar6];
      uVar3 = SimpSolver::ElimLt::cost(&this->lt,x);
      uVar4 = SimpSolver::ElimLt::cost(&this->lt,x_00);
      pVVar5 = (this->heap).data;
      if (uVar4 <= uVar3) {
        pVVar5 = pVVar5 + i;
        iVar6 = i;
        break;
      }
      iVar2 = pVVar5[iVar6];
      pVVar5[i] = iVar2;
      if ((this->indices).map.sz <= iVar2) goto LAB_0011336f;
      (this->indices).map.data[iVar2] = i;
      i = iVar6;
    } while (1 < uVar1);
  }
  *pVVar5 = x;
  if (x < (this->indices).map.sz) {
    (this->indices).map.data[x] = iVar6;
    return;
  }
LAB_0011336f:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void percolateUp(int i)
    {
        K   x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }